

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_simd(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int l;
  int col;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  float *pfVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  float *pfVar30;
  int iVar31;
  float *pfVar32;
  float *pfVar33;
  int iVar34;
  float *pfVar35;
  int row;
  float *pfVar36;
  int k_count;
  long lVar37;
  float *pfVar38;
  float *pfVar39;
  undefined1 auVar40 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 in_ZmmResult [64];
  undefined1 auVar68 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar78 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 in_ZMM7 [64];
  float fVar87;
  undefined1 auVar88 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar89 [16];
  undefined1 in_ZMM13 [64];
  
  pfVar32 = haarResponseY;
  pfVar30 = haarResponseX;
  auVar79._32_32_ = in_ZmmResult._32_32_;
  auVar79._0_32_ = vbroadcastss_avx512vl(ZEXT416((uint)ipoint->scale));
  auVar52 = auVar79._0_16_;
  auVar68._16_48_ = auVar79._16_48_;
  auVar40 = vmulss_avx512f(auVar52,auVar52);
  fVar70 = -0.08 / auVar40._0_4_;
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  auVar40 = vpternlogd_avx512vl(auVar49,SUB6416(ZEXT464(0x3effffff),0),ZEXT416((uint)ipoint->x),0xca
                               );
  auVar40 = ZEXT416((uint)(ipoint->x + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41._0_8_ = (double)auVar40._0_4_;
  auVar41._8_8_ = auVar40._8_8_;
  auVar68._0_16_ = vcvtss2sd_avx512f(auVar52,auVar52);
  auVar69._0_8_ = auVar68._0_8_;
  auVar69._8_56_ = auVar68._8_56_;
  auVar40 = vfmadd231sd_fma(auVar41,auVar69._0_16_,ZEXT816(0x3fe0000000000000));
  auVar45._0_4_ = (float)auVar40._0_8_;
  auVar45._4_12_ = auVar40._4_12_;
  auVar40 = vpternlogd_avx512vl(SUB6416(ZEXT464(0x3effffff),0),auVar49,ZEXT416((uint)ipoint->y),0xe2
                               );
  auVar40 = ZEXT416((uint)(ipoint->y + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar42._0_8_ = (double)auVar40._0_4_;
  auVar42._8_8_ = auVar40._8_8_;
  auVar40 = vfmadd231sd_fma(auVar42,auVar69._0_16_,ZEXT816(0x3fe0000000000000));
  auVar43._0_4_ = (float)auVar40._0_8_;
  auVar43._4_12_ = auVar40._4_12_;
  auVar40 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar52,auVar45);
  auVar40 = vinsertps_avx512f(auVar40,auVar52,0x10);
  auVar46._8_4_ = 0x3effffff;
  auVar46._0_8_ = 0x3effffff3effffff;
  auVar46._12_4_ = 0x3effffff;
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  auVar41 = vpternlogd_avx512vl(auVar47,auVar40,auVar46,0xea);
  auVar44._0_4_ = auVar40._0_4_ + auVar41._0_4_;
  auVar44._4_4_ = auVar40._4_4_ + auVar41._4_4_;
  auVar44._8_4_ = auVar40._8_4_ + auVar41._8_4_;
  auVar44._12_4_ = auVar40._12_4_ + auVar41._12_4_;
  auVar40 = vroundps_avx(auVar44,0xb);
  auVar48._0_4_ = (int)auVar40._0_4_;
  auVar48._4_4_ = (int)auVar40._4_4_;
  auVar48._8_4_ = (int)auVar40._8_4_;
  auVar48._12_4_ = (int)auVar40._12_4_;
  auVar41 = vpshufd_avx(auVar48,0x55);
  auVar40 = vcvtdq2ps_avx(auVar41);
  fVar72 = auVar45._0_4_ - auVar40._0_4_;
  fVar2 = auVar43._0_4_ - auVar40._0_4_;
  if (auVar48._4_4_ < auVar48._0_4_) {
    auVar40 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc1400000),0),auVar52,auVar43);
    auVar50._8_4_ = 0x80000000;
    auVar50._0_8_ = 0x8000000080000000;
    auVar50._12_4_ = 0x80000000;
    auVar42 = vpternlogd_avx512vl(auVar50,auVar40,auVar46,0xea);
    auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar42._0_4_));
    auVar40 = vroundss_avx(auVar40,auVar40,0xb);
    if (auVar48._4_4_ < (int)auVar40._0_4_) {
      auVar40 = vfmadd231ss_avx512f(auVar45,auVar52,ZEXT416(0x41300000));
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      auVar42 = vpternlogd_avx512vl(auVar51,auVar40,auVar46,0xea);
      auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar42._0_4_));
      auVar40 = vroundss_avx(auVar40,auVar40,0xb);
      if ((int)auVar40._0_4_ + auVar48._4_4_ <= iimage->width) {
        auVar42 = vfmadd231ss_avx512f(auVar43,auVar52,ZEXT416(0x41300000));
        auVar40._8_4_ = 0x80000000;
        auVar40._0_8_ = 0x8000000080000000;
        auVar40._12_4_ = 0x80000000;
        auVar40 = vpternlogd_avx512vl(auVar46,auVar42,auVar40,0xf8);
        auVar40 = ZEXT416((uint)(auVar42._0_4_ + auVar40._0_4_));
        auVar40 = vroundss_avx(auVar40,auVar40,0xb);
        if ((int)auVar40._0_4_ + auVar48._4_4_ <= iimage->height) {
          auVar53 = vpbroadcastq_avx512vl(auVar41);
          fVar72 = fVar72 + 0.5;
          auVar40 = vaddss_avx512f(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar2));
          auVar54 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk0_inner_arrays_simd);
          auVar55 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk1_inner_arrays_simd);
          auVar56 = vmulps_avx512vl(auVar79._0_32_,(undefined1  [32])kk2_inner_arrays_simd);
          auVar57._0_4_ = (int)(fVar72 + auVar54._0_4_);
          auVar57._4_4_ = (int)(fVar72 + auVar54._4_4_);
          auVar57._8_4_ = (int)(fVar72 + auVar54._8_4_);
          auVar57._12_4_ = (int)(fVar72 + auVar54._12_4_);
          auVar57._16_4_ = (int)(fVar72 + auVar54._16_4_);
          auVar57._20_4_ = (int)(fVar72 + auVar54._20_4_);
          auVar57._24_4_ = (int)(fVar72 + auVar54._24_4_);
          auVar57._28_4_ = (int)(fVar72 + auVar54._28_4_);
          auVar54._0_4_ = (int)(fVar72 + auVar55._0_4_);
          auVar54._4_4_ = (int)(fVar72 + auVar55._4_4_);
          auVar54._8_4_ = (int)(fVar72 + auVar55._8_4_);
          auVar54._12_4_ = (int)(fVar72 + auVar55._12_4_);
          auVar54._16_4_ = (int)(fVar72 + auVar55._16_4_);
          auVar54._20_4_ = (int)(fVar72 + auVar55._20_4_);
          auVar54._24_4_ = (int)(fVar72 + auVar55._24_4_);
          auVar54._28_4_ = (int)(fVar72 + auVar55._28_4_);
          auVar61._0_4_ = (int)(fVar72 + auVar56._0_4_);
          auVar61._4_4_ = (int)(fVar72 + auVar56._4_4_);
          auVar61._8_4_ = (int)(fVar72 + auVar56._8_4_);
          auVar61._12_4_ = (int)(fVar72 + auVar56._12_4_);
          auVar61._16_4_ = (int)(fVar72 + auVar56._16_4_);
          auVar61._20_4_ = (int)(fVar72 + auVar56._20_4_);
          auVar61._24_4_ = (int)(fVar72 + auVar56._24_4_);
          auVar61._28_4_ = (int)(fVar72 + auVar56._28_4_);
          auVar55 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
          auVar56 = vpaddd_avx512vl(auVar57,auVar55);
          auVar57 = vpaddd_avx512vl(auVar56,auVar53);
          auVar58 = vpaddd_avx512vl(auVar57,auVar53);
          auVar54 = vpaddd_avx2(auVar55,auVar54);
          auVar59 = vpaddd_avx512vl(auVar54,auVar53);
          auVar60 = vpaddd_avx512vl(auVar59,auVar53);
          auVar55 = vpaddd_avx2(auVar61,auVar55);
          auVar61 = vpaddd_avx512vl(auVar55,auVar53);
          auVar62 = vpaddd_avx512vl(auVar61,auVar53);
          iVar19 = -0xc;
          lVar18 = 0x40;
          do {
            auVar89._0_4_ = (float)iVar19;
            auVar89._4_12_ = in_ZMM13._4_12_;
            vfmadd213ss_avx512f(auVar89,auVar52,auVar40);
            iVar15 = iimage->data_width;
            auVar76._4_4_ = iVar15;
            auVar76._0_4_ = iVar15;
            auVar76._8_4_ = iVar15;
            auVar76._12_4_ = iVar15;
            auVar76._16_4_ = iVar15;
            auVar76._20_4_ = iVar15;
            auVar76._24_4_ = iVar15;
            auVar76._28_4_ = iVar15;
            auVar63 = vpbroadcastd_avx512vl();
            auVar64 = vpaddd_avx512vl(auVar63,auVar53);
            auVar65 = vpaddd_avx512vl(auVar64,auVar53);
            in_ZMM13 = ZEXT3264(auVar65);
            auVar84 = vpmulld_avx2(auVar76,auVar63);
            auVar66 = vpmulld_avx512vl(auVar76,auVar64);
            auVar76 = vpmulld_avx2(auVar76,auVar65);
            vpaddd_avx512vl(auVar84,auVar56);
            vpaddd_avx512vl(auVar84,auVar57);
            auVar67 = vpaddd_avx512vl(auVar84,auVar58);
            vpaddd_avx512vl(auVar66,auVar56);
            vpaddd_avx512vl(auVar66,auVar58);
            vpaddd_avx512vl(auVar76,auVar56);
            vpaddd_avx512vl(auVar76,auVar57);
            vpaddd_avx512vl(auVar76,auVar58);
            auVar84 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
            auVar81 = vgatherdps(ZEXT832(0) << 0x40,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2(auVar67,auVar67);
            auVar86 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar85 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar88 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar84 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vsubps_avx(auVar84,auVar81);
            auVar76 = vsubps_avx(auVar85,auVar76);
            auVar66 = vsubps_avx(auVar66,auVar88);
            auVar67 = vsubps_avx(auVar86,auVar67);
            auVar81 = vsubps_avx(auVar84,auVar76);
            pfVar35 = (float *)((long)pfVar30 + lVar18 + -0x40);
            *pfVar35 = auVar66._0_4_ + auVar66._0_4_ + auVar76._0_4_ + auVar84._0_4_;
            pfVar35[1] = auVar66._4_4_ + auVar66._4_4_ + auVar76._4_4_ + auVar84._4_4_;
            pfVar35[2] = auVar66._8_4_ + auVar66._8_4_ + auVar76._8_4_ + auVar84._8_4_;
            pfVar35[3] = auVar66._12_4_ + auVar66._12_4_ + auVar76._12_4_ + auVar84._12_4_;
            pfVar35[4] = auVar66._16_4_ + auVar66._16_4_ + auVar76._16_4_ + auVar84._16_4_;
            pfVar35[5] = auVar66._20_4_ + auVar66._20_4_ + auVar76._20_4_ + auVar84._20_4_;
            pfVar35[6] = auVar66._24_4_ + auVar66._24_4_ + auVar76._24_4_ + auVar84._24_4_;
            pfVar35[7] = auVar66._28_4_ + auVar66._28_4_ + auVar76._28_4_ + auVar84._28_4_;
            pfVar35 = (float *)((long)pfVar32 + lVar18 + -0x40);
            *pfVar35 = auVar67._0_4_ + auVar67._0_4_ + auVar81._0_4_;
            pfVar35[1] = auVar67._4_4_ + auVar67._4_4_ + auVar81._4_4_;
            pfVar35[2] = auVar67._8_4_ + auVar67._8_4_ + auVar81._8_4_;
            pfVar35[3] = auVar67._12_4_ + auVar67._12_4_ + auVar81._12_4_;
            pfVar35[4] = auVar67._16_4_ + auVar67._16_4_ + auVar81._16_4_;
            pfVar35[5] = auVar67._20_4_ + auVar67._20_4_ + auVar81._20_4_;
            pfVar35[6] = auVar67._24_4_ + auVar67._24_4_ + auVar81._24_4_;
            pfVar35[7] = auVar67._28_4_ + auVar67._28_4_ + auVar81._28_4_;
            iVar15 = iimage->data_width;
            auVar66._4_4_ = iVar15;
            auVar66._0_4_ = iVar15;
            auVar66._8_4_ = iVar15;
            auVar66._12_4_ = iVar15;
            auVar66._16_4_ = iVar15;
            auVar66._20_4_ = iVar15;
            auVar66._24_4_ = iVar15;
            auVar66._28_4_ = iVar15;
            auVar84 = vpmulld_avx2(auVar66,auVar63);
            auVar76 = vpmulld_avx2(auVar66,auVar64);
            auVar66 = vpmulld_avx2(auVar66,auVar65);
            vpaddd_avx2(auVar84,auVar54);
            vpaddd_avx512vl(auVar84,auVar59);
            vpaddd_avx512vl(auVar84,auVar60);
            vpaddd_avx2(auVar76,auVar54);
            vpaddd_avx512vl(auVar76,auVar60);
            vpaddd_avx2(auVar66,auVar54);
            vpaddd_avx512vl(auVar66,auVar59);
            vpaddd_avx512vl(auVar66,auVar60);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar88 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar81 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar85 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar86 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar84 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vsubps_avx(auVar84,auVar88);
            auVar76 = vsubps_avx(auVar76,auVar81);
            auVar66 = vsubps_avx(auVar66,auVar86);
            auVar67 = vsubps_avx(auVar67,auVar85);
            auVar81 = vsubps_avx(auVar84,auVar76);
            pfVar35 = (float *)((long)pfVar30 + lVar18 + -0x20);
            *pfVar35 = auVar66._0_4_ + auVar66._0_4_ + auVar76._0_4_ + auVar84._0_4_;
            pfVar35[1] = auVar66._4_4_ + auVar66._4_4_ + auVar76._4_4_ + auVar84._4_4_;
            pfVar35[2] = auVar66._8_4_ + auVar66._8_4_ + auVar76._8_4_ + auVar84._8_4_;
            pfVar35[3] = auVar66._12_4_ + auVar66._12_4_ + auVar76._12_4_ + auVar84._12_4_;
            pfVar35[4] = auVar66._16_4_ + auVar66._16_4_ + auVar76._16_4_ + auVar84._16_4_;
            pfVar35[5] = auVar66._20_4_ + auVar66._20_4_ + auVar76._20_4_ + auVar84._20_4_;
            pfVar35[6] = auVar66._24_4_ + auVar66._24_4_ + auVar76._24_4_ + auVar84._24_4_;
            pfVar35[7] = auVar66._28_4_ + auVar66._28_4_ + auVar76._28_4_ + auVar84._28_4_;
            pfVar35 = (float *)((long)pfVar32 + lVar18 + -0x20);
            *pfVar35 = auVar67._0_4_ + auVar67._0_4_ + auVar81._0_4_;
            pfVar35[1] = auVar67._4_4_ + auVar67._4_4_ + auVar81._4_4_;
            pfVar35[2] = auVar67._8_4_ + auVar67._8_4_ + auVar81._8_4_;
            pfVar35[3] = auVar67._12_4_ + auVar67._12_4_ + auVar81._12_4_;
            pfVar35[4] = auVar67._16_4_ + auVar67._16_4_ + auVar81._16_4_;
            pfVar35[5] = auVar67._20_4_ + auVar67._20_4_ + auVar81._20_4_;
            pfVar35[6] = auVar67._24_4_ + auVar67._24_4_ + auVar81._24_4_;
            pfVar35[7] = auVar67._28_4_ + auVar67._28_4_ + auVar81._28_4_;
            iVar15 = iimage->data_width;
            auVar67._4_4_ = iVar15;
            auVar67._0_4_ = iVar15;
            auVar67._8_4_ = iVar15;
            auVar67._12_4_ = iVar15;
            auVar67._16_4_ = iVar15;
            auVar67._20_4_ = iVar15;
            auVar67._24_4_ = iVar15;
            auVar67._28_4_ = iVar15;
            auVar84 = vpmulld_avx2(auVar67,auVar63);
            auVar76 = vpmulld_avx2(auVar67,auVar64);
            auVar66 = vpmulld_avx2(auVar67,auVar65);
            vpaddd_avx2(auVar55,auVar84);
            vpaddd_avx512vl(auVar84,auVar61);
            vpaddd_avx2(auVar62,auVar84);
            vpaddd_avx2(auVar55,auVar76);
            vpaddd_avx2(auVar62,auVar76);
            vpaddd_avx2(auVar55,auVar66);
            vpaddd_avx512vl(auVar66,auVar61);
            vpaddd_avx2(auVar62,auVar66);
            auVar84 = vpcmpeqd_avx2(auVar64,auVar64);
            auVar65 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar66 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar81 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar67 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar63 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar76 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar64 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            in_ZMM7 = ZEXT3264(auVar64);
            auVar84 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar84 = vgatherdps(ZEXT832(0) << 0x20,auVar84);
            auVar84 = vsubps_avx(auVar84,auVar65);
            auVar76 = vsubps_avx(auVar76,auVar81);
            auVar66 = vsubps_avx(auVar66,auVar64);
            auVar67 = vsubps_avx(auVar67,auVar63);
            auVar81 = vsubps_avx(auVar84,auVar76);
            pfVar35 = (float *)((long)pfVar30 + lVar18);
            *pfVar35 = auVar66._0_4_ + auVar66._0_4_ + auVar76._0_4_ + auVar84._0_4_;
            pfVar35[1] = auVar66._4_4_ + auVar66._4_4_ + auVar76._4_4_ + auVar84._4_4_;
            pfVar35[2] = auVar66._8_4_ + auVar66._8_4_ + auVar76._8_4_ + auVar84._8_4_;
            pfVar35[3] = auVar66._12_4_ + auVar66._12_4_ + auVar76._12_4_ + auVar84._12_4_;
            pfVar35[4] = auVar66._16_4_ + auVar66._16_4_ + auVar76._16_4_ + auVar84._16_4_;
            pfVar35[5] = auVar66._20_4_ + auVar66._20_4_ + auVar76._20_4_ + auVar84._20_4_;
            pfVar35[6] = auVar66._24_4_ + auVar66._24_4_ + auVar76._24_4_ + auVar84._24_4_;
            pfVar35[7] = auVar66._28_4_ + auVar66._28_4_ + auVar76._28_4_ + auVar84._28_4_;
            pfVar35 = (float *)((long)pfVar32 + lVar18);
            *pfVar35 = auVar67._0_4_ + auVar67._0_4_ + auVar81._0_4_;
            pfVar35[1] = auVar67._4_4_ + auVar67._4_4_ + auVar81._4_4_;
            pfVar35[2] = auVar67._8_4_ + auVar67._8_4_ + auVar81._8_4_;
            pfVar35[3] = auVar67._12_4_ + auVar67._12_4_ + auVar81._12_4_;
            pfVar35[4] = auVar67._16_4_ + auVar67._16_4_ + auVar81._16_4_;
            pfVar35[5] = auVar67._20_4_ + auVar67._20_4_ + auVar81._20_4_;
            pfVar35[6] = auVar67._24_4_ + auVar67._24_4_ + auVar81._24_4_;
            pfVar35[7] = auVar67._28_4_ + auVar67._28_4_ + auVar81._28_4_;
            iVar19 = iVar19 + 1;
            lVar18 = lVar18 + 0x60;
          } while (lVar18 != 0x940);
          goto LAB_00196cf4;
        }
      }
    }
  }
  iVar19 = auVar48._4_4_ * 2;
  iVar15 = -0xc;
  lVar22 = 0;
  lVar18 = 0;
  do {
    auVar73._0_4_ = (float)iVar15;
    auVar73._4_12_ = in_ZMM7._4_12_;
    auVar40 = vfmadd213ss_avx512f(auVar73,auVar52,ZEXT416((uint)fVar2));
    fVar71 = auVar40._0_4_;
    row = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                        (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
    lVar37 = 0;
    lVar21 = lVar22;
    do {
      auVar74._0_4_ = (float)((int)lVar37 + -0xc);
      auVar74._4_12_ = in_ZMM7._4_12_;
      auVar40 = vfmadd213ss_avx512f(auVar74,auVar52,ZEXT416((uint)fVar72));
      fVar71 = auVar40._0_4_;
      pfVar30 = (float *)((long)haarResponseY + lVar21);
      col = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                          (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      if ((((row < 1) || (col < 1)) || (iimage->height < iVar19 + row)) ||
         (iVar17 = iVar19 + col, iimage->width < iVar17)) {
        haarXY(iimage,row,col,auVar48._4_4_,(float *)((long)haarResponseX + lVar21),pfVar30);
      }
      else {
        iVar1 = col + -1 + auVar48._4_4_;
        pfVar32 = iimage->data;
        iVar26 = iimage->data_width;
        iVar31 = iVar26 * (row + -1);
        iVar34 = iVar26 * (row + -1 + auVar48._4_4_);
        fVar71 = pfVar32[iVar34 + -1 + col];
        iVar26 = iVar26 * (iVar19 + -1 + row);
        fVar3 = pfVar32[iVar26 + -1 + col];
        fVar4 = pfVar32[iVar26 + -1 + iVar17];
        fVar5 = pfVar32[iVar31 + -1 + col];
        fVar6 = pfVar32[iVar31 + -1 + iVar17];
        fVar83 = pfVar32[iVar34 + -1 + iVar17];
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar31 + iVar1] - pfVar32[iVar26 + iVar1]))
                                  ,SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(fVar4 - fVar5)));
        *(float *)((long)haarResponseX + lVar21) = (fVar3 - fVar6) + auVar40._0_4_;
        auVar40 = vfmadd213ss_fma(ZEXT416((uint)(fVar71 - fVar83)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar4 - fVar5)));
        *pfVar30 = auVar40._0_4_ - (fVar3 - fVar6);
      }
      lVar37 = lVar37 + 1;
      lVar21 = lVar21 + 4;
    } while (lVar37 != 0x18);
    iVar15 = iVar15 + 1;
    lVar18 = lVar18 + 1;
    lVar22 = lVar22 + 0x60;
  } while (lVar18 != 0x18);
LAB_00196cf4:
  auVar75._8_4_ = 0x80000000;
  auVar75._0_8_ = 0x8000000080000000;
  auVar75._12_4_ = 0x80000000;
  auVar77._8_4_ = 0x3effffff;
  auVar77._0_8_ = 0x3effffff3effffff;
  auVar77._12_4_ = 0x3effffff;
  auVar40 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar41 = vpternlogd_avx512vl(auVar77,auVar40,auVar75,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vmulss_avx512f(auVar52,ZEXT416(0x3fc00000));
  auVar42 = vpternlogd_avx512vl(auVar77,auVar41,auVar75,0xf8);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vmulss_avx512f(auVar52,ZEXT416(0x40200000));
  auVar43 = vpternlogd_avx512vl(auVar77,auVar42,auVar75,0xf8);
  auVar42 = ZEXT416((uint)(auVar42._0_4_ + auVar43._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vmulss_avx512f(auVar52,ZEXT416(0x40600000));
  auVar44 = vpternlogd_avx512vl(auVar77,auVar43,auVar75,0xf8);
  auVar43 = ZEXT416((uint)(auVar43._0_4_ + auVar44._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vmulss_avx512f(auVar52,ZEXT416(0x40900000));
  auVar45 = vpternlogd_avx512vl(auVar77,auVar44,auVar75,0xf8);
  auVar44 = ZEXT416((uint)(auVar44._0_4_ + auVar45._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vmulss_avx512f(auVar52,ZEXT416(0x40b00000));
  auVar46 = vpternlogd_avx512vl(auVar77,auVar45,auVar75,0xf8);
  auVar45 = ZEXT416((uint)(auVar46._0_4_ + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vmulss_avx512f(auVar52,ZEXT416(0x40d00000));
  auVar47 = vpternlogd_avx512vl(auVar77,auVar46,auVar75,0xf8);
  auVar46 = ZEXT416((uint)(auVar46._0_4_ + auVar47._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vmulss_avx512f(auVar52,ZEXT416(0x40f00000));
  auVar48 = vpternlogd_avx512vl(auVar77,auVar47,auVar75,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + auVar48._0_4_));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vmulss_avx512f(auVar52,ZEXT416(0x41080000));
  auVar49 = vpternlogd_avx512vl(auVar77,auVar48,auVar75,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vmulss_avx512f(auVar52,ZEXT416(0x41180000));
  auVar50 = vpternlogd_avx512vl(auVar77,auVar49,auVar75,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar50._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vmulss_avx512f(auVar52,ZEXT416(0x41280000));
  auVar51 = vpternlogd_avx512vl(auVar77,auVar50,auVar75,0xf8);
  auVar50 = ZEXT416((uint)(auVar50._0_4_ + auVar51._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52 = vmulss_avx512f(auVar52,ZEXT416(0x41380000));
  auVar51 = vpternlogd_avx512vl(auVar77,auVar52,auVar75,0xf8);
  auVar52 = ZEXT416((uint)(auVar52._0_4_ + auVar51._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  fVar83 = auVar42._0_4_;
  fVar72 = fVar83 + auVar41._0_4_;
  fVar2 = fVar83 + auVar40._0_4_;
  fVar71 = fVar83 - auVar40._0_4_;
  fVar3 = fVar83 - auVar41._0_4_;
  fVar4 = fVar83 - auVar43._0_4_;
  fVar5 = fVar83 - auVar44._0_4_;
  fVar6 = fVar83 - auVar45._0_4_;
  fVar83 = fVar83 - auVar46._0_4_;
  fVar87 = auVar47._0_4_;
  fVar7 = fVar87 - auVar43._0_4_;
  fVar8 = fVar87 - auVar44._0_4_;
  fVar9 = fVar87 - auVar45._0_4_;
  fVar10 = fVar87 - auVar46._0_4_;
  fVar11 = fVar87 - auVar48._0_4_;
  fVar12 = fVar87 - auVar49._0_4_;
  fVar13 = fVar87 - auVar50._0_4_;
  fVar87 = fVar87 - auVar52._0_4_;
  gauss_s1_c0[0] = expf(fVar72 * fVar72 * fVar70);
  gauss_s1_c0[1] = expf(fVar2 * fVar2 * fVar70);
  gauss_s1_c0[2] = expf(fVar71 * fVar71 * fVar70);
  gauss_s1_c0[3] = expf(fVar3 * fVar3 * fVar70);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar70);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar70);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar70);
  gauss_s1_c0[8] = expf(fVar83 * fVar83 * fVar70);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar70);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar70);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar70);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar70);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar70);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar70);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar70);
  gauss_s1_c1[8] = expf(fVar87 * fVar87 * fVar70);
  uVar29 = 0xfffffff8;
  lVar18 = 0;
  fVar72 = 0.0;
  lVar22 = 0;
  auVar52._8_4_ = 0x7fffffff;
  auVar52._0_8_ = 0x7fffffff7fffffff;
  auVar52._12_4_ = 0x7fffffff;
  pfVar30 = haarResponseX;
  pfVar32 = haarResponseY;
  do {
    uVar27 = (uint)uVar29;
    pfVar35 = gauss_s1_c0;
    if (uVar27 == 7) {
      pfVar35 = gauss_s1_c1;
    }
    if (uVar27 == 0xfffffff8) {
      pfVar35 = gauss_s1_c1;
    }
    lVar18 = (long)(int)lVar18;
    iVar19 = (int)lVar22;
    lVar22 = (long)iVar19;
    uVar24 = 0;
    uVar28 = 0xfffffff8;
    pfVar25 = pfVar30;
    pfVar33 = pfVar32;
    do {
      pfVar23 = gauss_s1_c0;
      if (uVar28 == 7) {
        pfVar23 = gauss_s1_c1;
      }
      if (uVar28 == 0xfffffff8) {
        pfVar23 = gauss_s1_c1;
      }
      uVar20 = (ulong)(uVar28 >> 0x1c & 0xfffffff8);
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar16 = uVar24;
      pfVar36 = pfVar33;
      pfVar38 = pfVar25;
      do {
        lVar21 = 0;
        pfVar39 = (float *)((long)pfVar35 + (ulong)(uint)((int)(uVar29 >> 0x1f) << 5));
        do {
          fVar2 = pfVar23[uVar20] * *pfVar39;
          auVar40 = vinsertps_avx(ZEXT416((uint)pfVar36[lVar21]),ZEXT416((uint)pfVar38[lVar21]),0x10
                                 );
          auVar82._0_4_ = fVar2 * auVar40._0_4_;
          auVar82._4_4_ = fVar2 * auVar40._4_4_;
          auVar82._8_4_ = fVar2 * auVar40._8_4_;
          auVar82._12_4_ = fVar2 * auVar40._12_4_;
          auVar40 = vandps_avx(auVar82,auVar52);
          auVar40 = vmovlhps_avx(auVar82,auVar40);
          auVar78._0_4_ = auVar79._0_4_ + auVar40._0_4_;
          auVar78._4_4_ = auVar79._4_4_ + auVar40._4_4_;
          auVar78._8_4_ = auVar79._8_4_ + auVar40._8_4_;
          auVar78._12_4_ = auVar79._12_4_ + auVar40._12_4_;
          auVar79 = ZEXT1664(auVar78);
          pfVar39 = pfVar39 + (ulong)(~uVar27 >> 0x1f) * 2 + -1;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 9);
        uVar16 = uVar16 + 0x18;
        uVar20 = uVar20 + (ulong)(-1 < (int)uVar28) * 2 + -1;
        pfVar38 = pfVar38 + 0x18;
        pfVar36 = pfVar36 + 0x18;
      } while (uVar16 < uVar28 * 0x18 + 0x198);
      fVar2 = gauss_s2_arr[lVar22];
      auVar14._4_4_ = fVar2;
      auVar14._0_4_ = fVar2;
      auVar14._8_4_ = fVar2;
      auVar14._12_4_ = fVar2;
      auVar42 = vmulps_avx512vl(auVar78,auVar14);
      lVar22 = lVar22 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar18) = auVar42;
      auVar80._0_4_ = auVar42._0_4_ * auVar42._0_4_;
      auVar80._4_4_ = auVar42._4_4_ * auVar42._4_4_;
      auVar80._8_4_ = auVar42._8_4_ * auVar42._8_4_;
      auVar80._12_4_ = auVar42._12_4_ * auVar42._12_4_;
      auVar40 = vmovshdup_avx(auVar80);
      auVar41 = vfmadd231ss_fma(auVar40,auVar42,auVar42);
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      auVar41 = vfmadd213ss_fma(auVar40,auVar40,auVar41);
      auVar40 = vshufps_avx(auVar42,auVar42,0xff);
      auVar40 = vfmadd213ss_fma(auVar40,auVar40,auVar41);
      fVar72 = fVar72 + auVar40._0_4_;
      lVar18 = lVar18 + 4;
      uVar28 = uVar28 + 5;
      uVar24 = uVar24 + 0x78;
      pfVar25 = pfVar25 + 0x78;
      pfVar33 = pfVar33 + 0x78;
    } while (iVar19 + 4 != (int)lVar22);
    pfVar30 = pfVar30 + 5;
    pfVar32 = pfVar32 + 5;
    uVar29 = (ulong)(uVar27 + 5);
  } while ((int)uVar27 < 3);
  if (fVar72 < 0.0) {
    fVar72 = sqrtf(fVar72);
  }
  else {
    auVar40 = vsqrtss_avx(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
    fVar72 = auVar40._0_4_;
  }
  auVar79 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar72)));
  lVar18 = 0;
  do {
    auVar69 = vmulps_avx512f(auVar79,*(undefined1 (*) [64])(ipoint->descriptor + lVar18));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar18) = auVar69;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_simd(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            float ipoint_y_sub_int_scale_add_l_mul_scale = ipoint_y_sub_int_scale + l * scale;
            int sample_y_sub_int_scale = (int) (ipoint_y_sub_int_scale_add_l_mul_scale + (ipoint_y_sub_int_scale_add_l_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                float ipoint_x_sub_int_scale_add_k_mul_scale = ipoint_x_sub_int_scale + k * scale;
                int sample_x_sub_int_scale = (int) (ipoint_x_sub_int_scale_add_k_mul_scale + (ipoint_x_sub_int_scale_add_k_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            int sample_y_sub_int_scale = (int)(ipoint_y_sub_int_scale_add_05 + l * scale);

            __m256i sample_y_sub_int_scale_vec = _mm256_set1_epi32(sample_y_sub_int_scale);

            __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
            __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
            __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

            __m256 ipoint_x_sub_int_scale_add_05_vec = _mm256_set1_ps(ipoint_x_sub_int_scale_add_05);

            // USE CVTTPS_EPI32 FOR TRUNCATION!!!
            __m256i sample_col0 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks0));
            __m256i sample_col1 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks1));
            __m256i sample_col2 = _mm256_cvttps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_add_05_vec, kks2));
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col0, int_scale_vec, 
                                            &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col1, int_scale_vec, 
                                            &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec, sample_col2, int_scale_vec, 
                                            &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}